

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsArgumentVariable(FunctionData *function,VariableData *data)

{
  VariableHandle *pVVar1;
  IntrusiveList<VariableHandle> *pIVar2;
  
  pIVar2 = &function->argumentVariables;
  do {
    pVVar1 = pIVar2->head;
    if (pVVar1 == (VariableHandle *)0x0) {
      return function->contextArgument == data;
    }
    pIVar2 = (IntrusiveList<VariableHandle> *)&pVVar1->next;
  } while (pVVar1->variable != data);
  return true;
}

Assistant:

bool IsArgumentVariable(FunctionData *function, VariableData *data)
{
	for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
	{
		if(data == curr->variable)
			return true;
	}

	if(data == function->contextArgument)
		return true;

	return false;
}